

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

int read_markers(j_decompress_ptr cinfo)

{
  UINT16 *pUVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  JOCTET JVar5;
  JOCTET JVar6;
  byte bVar7;
  jpeg_source_mgr *pjVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  boolean bVar27;
  int iVar28;
  uint uVar29;
  jpeg_error_mgr *pjVar30;
  jpeg_marker_reader *pjVar31;
  JHUFF_TBL *pJVar32;
  JQUANT_TBL *pJVar33;
  long lVar34;
  boolean is_arith;
  ulong uVar35;
  UINT16 UVar36;
  uint uVar37;
  long lVar38;
  boolean is_baseline;
  size_t sVar39;
  JOCTET *pJVar40;
  size_t sVar41;
  byte *pbVar42;
  JHUFF_TBL **ppJVar43;
  byte *pbVar44;
  ulong uVar45;
  jpeg_component_info *pjVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  UINT8 bits [17];
  int *local_1b0;
  byte local_188;
  uint uStack_187;
  undefined3 uStack_183;
  undefined1 uStack_180;
  uint uStack_17f;
  undefined3 uStack_17b;
  UINT8 UStack_178;
  UINT8 *local_168;
  UINT8 *local_160;
  UINT8 *local_158;
  ulong local_150;
  JHUFF_TBL **local_148;
  JHUFF_TBL **local_140;
  byte local_138 [264];
  
  local_140 = cinfo->ac_huff_tbl_ptrs;
  local_148 = cinfo->dc_huff_tbl_ptrs;
  local_160 = cinfo->arith_dc_L;
  local_168 = cinfo->arith_dc_U;
  local_158 = cinfo->arith_ac_K;
  uVar37 = cinfo->unread_marker;
  do {
    if (uVar37 == 0) {
      if (cinfo->marker->saw_SOI == 0) {
        pjVar8 = cinfo->src;
        sVar39 = pjVar8->bytes_in_buffer;
        if (sVar39 == 0) {
          bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
          if (bVar27 == 0) goto LAB_00106a0d;
          sVar39 = pjVar8->bytes_in_buffer;
        }
        bVar3 = *pjVar8->next_input_byte;
        sVar39 = sVar39 - 1;
        if (sVar39 == 0) {
          bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
          if (bVar27 == 0) goto LAB_00106a0d;
          pbVar42 = pjVar8->next_input_byte;
          sVar39 = pjVar8->bytes_in_buffer;
        }
        else {
          pbVar42 = pjVar8->next_input_byte + 1;
        }
        bVar4 = *pbVar42;
        uVar37 = (uint)bVar4;
        if (bVar4 != 0xd8 || bVar3 != 0xff) {
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x37;
          *(uint *)&pjVar30->msg_parm = (uint)bVar3;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)bVar4;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        cinfo->unread_marker = (uint)bVar4;
        pjVar8->next_input_byte = pbVar42 + 1;
        pjVar8->bytes_in_buffer = sVar39 - 1;
      }
      else {
        bVar27 = next_marker(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        uVar37 = cinfo->unread_marker;
      }
    }
    switch(uVar37) {
    case 0xc0:
      is_baseline = 1;
      goto LAB_00105d41;
    case 0xc1:
      is_baseline = 0;
LAB_00105d41:
      bVar27 = 0;
LAB_00105d43:
      is_arith = 0;
LAB_00105e5b:
      bVar27 = get_sof(cinfo,is_baseline,bVar27,is_arith);
      if (bVar27 == 0) {
        return 0;
      }
      break;
    case 0xc2:
      is_baseline = 0;
      bVar27 = 1;
      goto LAB_00105d43;
    case 0xc3:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xcb:
    case 0xcd:
    case 0xce:
    case 0xcf:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x3e;
      goto LAB_00105c6a;
    case 0xc4:
      pjVar8 = cinfo->src;
      sVar39 = pjVar8->bytes_in_buffer;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      bVar3 = *pjVar8->next_input_byte;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pbVar42 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pbVar42 = pjVar8->next_input_byte + 1;
      }
      uVar45 = (ulong)bVar3 * 0x100;
      sVar39 = sVar39 - 1;
      pbVar44 = pbVar42 + 1;
      lVar34 = *pbVar42 + uVar45 + -2;
      if (0x12 < (uVar45 | *pbVar42)) {
        do {
          if (sVar39 == 0) {
            bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
            if (bVar27 == 0) goto LAB_00106a0d;
            pbVar44 = pjVar8->next_input_byte;
            sVar39 = pjVar8->bytes_in_buffer;
          }
          bVar3 = *pbVar44;
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x52;
          *(uint *)&pjVar30->msg_parm = (uint)bVar3;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          local_188 = 0;
          pbVar44 = pbVar44 + 1;
          sVar39 = sVar39 - 1;
          uVar37 = 0;
          lVar38 = 1;
          do {
            if (sVar39 == 0) {
              bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
              if (bVar27 == 0) goto LAB_00106a0d;
              pbVar44 = pjVar8->next_input_byte;
              sVar39 = pjVar8->bytes_in_buffer;
            }
            bVar4 = *pbVar44;
            (&local_188)[lVar38] = bVar4;
            uVar37 = uVar37 + bVar4;
            lVar38 = lVar38 + 1;
            pbVar44 = pbVar44 + 1;
            sVar39 = sVar39 - 1;
          } while (lVar38 != 0x11);
          pjVar30 = cinfo->err;
          auVar13[0xc] = (char)(uStack_187 >> 0x18);
          auVar13._0_12_ = ZEXT712(0);
          auVar25[1] = 0;
          auVar25[0] = (byte)(uStack_187 >> 0x10);
          auVar25._2_3_ = auVar13._10_3_;
          auVar25._5_8_ = 0;
          auVar48[5] = 0;
          auVar48[4] = (byte)(uStack_187 >> 8);
          auVar48._6_7_ = SUB137(auVar25 << 0x40,6);
          auVar48._0_4_ = uStack_187 & 0xff;
          auVar48._13_3_ = 0;
          *(undefined1 (*) [16])&pjVar30->msg_parm = auVar48;
          uVar45 = (ulong)(ushort)_uStack_183 & 0xffffffffffff00ff;
          auVar14._8_4_ = 0;
          auVar14._0_8_ = uVar45;
          auVar14[0xc] = (char)((uint)_uStack_183 >> 0x18);
          auVar15[8] = (char)((uint)_uStack_183 >> 0x10);
          auVar15._0_8_ = uVar45;
          auVar15[9] = 0;
          auVar15._10_3_ = auVar14._10_3_;
          auVar21._5_8_ = 0;
          auVar21._0_5_ = auVar15._8_5_;
          auVar49._0_4_ = (undefined4)uVar45;
          auVar16[4] = (char)((uint)_uStack_183 >> 8);
          auVar16._0_4_ = auVar49._0_4_;
          auVar16[5] = 0;
          auVar16._6_7_ = SUB137(auVar21 << 0x40,6);
          auVar49._4_9_ = auVar16._4_9_;
          auVar49._13_3_ = 0;
          *(undefined1 (*) [16])((long)&pjVar30->msg_parm + 0x10) = auVar49;
          pjVar30->msg_code = 0x58;
          (*pjVar30->emit_message)((j_common_ptr)cinfo,2);
          pjVar30 = cinfo->err;
          auVar17[0xc] = (char)(uStack_17f >> 0x18);
          auVar17._0_12_ = ZEXT712(0);
          auVar26[1] = 0;
          auVar26[0] = (byte)(uStack_17f >> 0x10);
          auVar26._2_3_ = auVar17._10_3_;
          auVar26._5_8_ = 0;
          auVar50[5] = 0;
          auVar50[4] = (byte)(uStack_17f >> 8);
          auVar50._6_7_ = SUB137(auVar26 << 0x40,6);
          auVar50._0_4_ = uStack_17f & 0xff;
          auVar50._13_3_ = 0;
          *(undefined1 (*) [16])&pjVar30->msg_parm = auVar50;
          uVar45 = (ulong)(ushort)_uStack_17b & 0xffffffffffff00ff;
          auVar18._8_4_ = 0;
          auVar18._0_8_ = uVar45;
          auVar18[0xc] = (char)((uint)_uStack_17b >> 0x18);
          auVar19[8] = (char)((uint)_uStack_17b >> 0x10);
          auVar19._0_8_ = uVar45;
          auVar19[9] = 0;
          auVar19._10_3_ = auVar18._10_3_;
          auVar22._5_8_ = 0;
          auVar22._0_5_ = auVar19._8_5_;
          auVar51._0_4_ = (undefined4)uVar45;
          auVar20[4] = (char)((uint)_uStack_17b >> 8);
          auVar20._0_4_ = auVar51._0_4_;
          auVar20[5] = 0;
          auVar20._6_7_ = SUB137(auVar22 << 0x40,6);
          auVar51._4_9_ = auVar20._4_9_;
          auVar51._13_3_ = 0;
          *(undefined1 (*) [16])((long)&pjVar30->msg_parm + 0x10) = auVar51;
          pjVar30->msg_code = 0x58;
          (*pjVar30->emit_message)((j_common_ptr)cinfo,2);
          uVar45 = (ulong)uVar37;
          if ((0x100 < uVar37) || (lVar34 + -0x11 < (long)uVar45)) {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 9;
            (*pjVar30->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar37 != 0) {
            uVar35 = 0;
            do {
              if (sVar39 == 0) {
                bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
                if (bVar27 == 0) goto LAB_00106a0d;
                pbVar44 = pjVar8->next_input_byte;
                sVar39 = pjVar8->bytes_in_buffer;
              }
              sVar39 = sVar39 - 1;
              bVar4 = *pbVar44;
              pbVar44 = pbVar44 + 1;
              local_138[uVar35] = bVar4;
              uVar35 = uVar35 + 1;
            } while (uVar45 != uVar35);
          }
          uVar29 = bVar3 - 0x10;
          bVar47 = (bVar3 & 0x10) == 0;
          uVar37 = uVar29;
          if (bVar47) {
            uVar37 = (uint)bVar3;
          }
          ppJVar43 = local_148 + bVar3;
          if (!bVar47) {
            ppJVar43 = local_140 + uVar29;
          }
          if (3 < (int)uVar37) {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 0x1f;
            (pjVar30->msg_parm).i[0] = uVar37;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          pJVar32 = *ppJVar43;
          if (pJVar32 == (JHUFF_TBL *)0x0) {
            pJVar32 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
            *ppJVar43 = pJVar32;
          }
          lVar34 = (lVar34 + -0x11) - uVar45;
          pJVar32->bits[0x10] = UStack_178;
          *(ulong *)pJVar32->bits = CONCAT35(uStack_183,CONCAT41(uStack_187,local_188));
          *(ulong *)(pJVar32->bits + 8) = CONCAT35(uStack_17b,CONCAT41(uStack_17f,uStack_180));
          memcpy((*ppJVar43)->huffval,local_138,0x100);
        } while (0x10 < lVar34);
      }
      if (lVar34 != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xc;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      pjVar8->next_input_byte = pbVar44;
      pjVar8->bytes_in_buffer = sVar39;
      break;
    case 0xc9:
      bVar27 = 0;
      goto LAB_00105e56;
    case 0xca:
      bVar27 = 1;
LAB_00105e56:
      is_baseline = 0;
      is_arith = 1;
      goto LAB_00105e5b;
    case 0xcc:
      pjVar8 = cinfo->src;
      sVar39 = pjVar8->bytes_in_buffer;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      bVar3 = *pjVar8->next_input_byte;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pbVar42 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pbVar42 = pjVar8->next_input_byte + 1;
      }
      uVar35 = (ulong)bVar3 * 0x100;
      uVar45 = uVar35 | *pbVar42;
      pbVar44 = pbVar42 + 1;
      sVar39 = sVar39 - 1;
      if (uVar45 < 3) {
        lVar34 = uVar35 + *pbVar42 + -2;
      }
      else {
        do {
          uVar35 = uVar45;
          if (sVar39 == 0) {
            bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
            if (bVar27 == 0) goto LAB_00106a0d;
            pbVar44 = pjVar8->next_input_byte;
            sVar39 = pjVar8->bytes_in_buffer;
          }
          bVar3 = *pbVar44;
          sVar39 = sVar39 - 1;
          if (sVar39 == 0) {
            bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
            if (bVar27 == 0) goto LAB_00106a0d;
            pbVar44 = pjVar8->next_input_byte;
            sVar39 = pjVar8->bytes_in_buffer;
          }
          else {
            pbVar44 = pbVar44 + 1;
          }
          bVar4 = *pbVar44;
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x51;
          uVar37 = (uint)bVar3;
          (pjVar30->msg_parm).i[0] = uVar37;
          (cinfo->err->msg_parm).i[1] = (uint)bVar4;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (bVar3 < 0x20) {
            if (0xf < bVar3) goto LAB_00106579;
            local_160[uVar37] = bVar4 & 0xf;
            local_168[uVar37] = bVar4 >> 4;
            if (bVar4 >> 4 < (bVar4 & 0xf)) {
              pjVar30 = cinfo->err;
              pjVar30->msg_code = 0x1e;
              (pjVar30->msg_parm).i[0] = (uint)bVar4;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
          }
          else {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 0x1d;
            (pjVar30->msg_parm).i[0] = (uint)bVar3;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00106579:
            local_158[bVar3 - 0x10] = bVar4;
          }
          pbVar44 = pbVar44 + 1;
          sVar39 = sVar39 - 1;
          uVar45 = uVar35 - 2;
        } while (2 < uVar45);
        lVar34 = uVar35 - 4;
      }
      if (lVar34 != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xc;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      pjVar8->next_input_byte = pbVar44;
      pjVar8->bytes_in_buffer = sVar39;
      break;
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      goto switchD_00105c3b_caseD_d0;
    case 0xd8:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x68;
      (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
      pjVar31 = cinfo->marker;
      if (pjVar31->saw_SOI != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0x3f;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
        pjVar31 = cinfo->marker;
      }
      local_160[0] = '\0';
      local_160[1] = '\0';
      local_160[2] = '\0';
      local_160[3] = '\0';
      local_160[4] = '\0';
      local_160[5] = '\0';
      local_160[6] = '\0';
      local_160[7] = '\0';
      local_160[8] = '\0';
      local_160[9] = '\0';
      local_160[10] = '\0';
      local_160[0xb] = '\0';
      local_160[0xc] = '\0';
      local_160[0xd] = '\0';
      local_160[0xe] = '\0';
      local_160[0xf] = '\0';
      builtin_memcpy(local_168,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                     0x10);
      builtin_memcpy(local_158,"\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",
                     0x10);
      cinfo->restart_interval = 0;
      cinfo->saw_JFIF_marker = 0;
      cinfo->jpeg_color_space = JCS_UNKNOWN;
      cinfo->CCIR601_sampling = 0;
      cinfo->JFIF_major_version = '\x01';
      cinfo->JFIF_minor_version = '\x01';
      cinfo->density_unit = '\0';
      cinfo->X_density = 1;
      cinfo->Y_density = 1;
      cinfo->saw_Adobe_marker = 0;
      cinfo->Adobe_transform = '\0';
      pjVar31->saw_SOI = 1;
      break;
    case 0xd9:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x57;
      (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
      cinfo->unread_marker = 0;
      return 2;
    case 0xda:
      pjVar8 = cinfo->src;
      pJVar40 = pjVar8->next_input_byte;
      sVar39 = pjVar8->bytes_in_buffer;
      if (cinfo->marker->saw_SOF == 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0x40;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pJVar40 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      JVar5 = *pJVar40;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pJVar40 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pJVar40 = pJVar40 + 1;
      }
      JVar6 = *pJVar40;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pbVar42 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pbVar42 = pJVar40 + 1;
      }
      bVar3 = *pbVar42;
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x69;
      (pjVar30->msg_parm).i[0] = (uint)bVar3;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      uVar37 = (uint)bVar3;
      if ((CONCAT11(JVar5,JVar6) == (ushort)((ushort)bVar3 * 2 + 6)) && (bVar3 < 5)) {
        if ((ulong)bVar3 == 0) {
          if (cinfo->progressive_mode == 0) goto LAB_001067e9;
          cinfo->comps_in_scan = (uint)bVar3;
          goto LAB_001068ff;
        }
        cinfo->comps_in_scan = uVar37;
      }
      else {
LAB_001067e9:
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xc;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
        cinfo->comps_in_scan = uVar37;
        if (uVar37 == 0) {
LAB_001068ff:
          sVar39 = sVar39 - 1;
          pbVar42 = pbVar42 + 1;
          bVar47 = true;
          goto LAB_00106902;
        }
      }
      sVar39 = sVar39 - 1;
      pbVar42 = pbVar42 + 1;
      uVar45 = 0;
      goto LAB_0010681a;
    case 0xdb:
      pjVar8 = cinfo->src;
      sVar39 = pjVar8->bytes_in_buffer;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      bVar3 = *pjVar8->next_input_byte;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pbVar42 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pbVar42 = pjVar8->next_input_byte + 1;
      }
      uVar35 = (ulong)bVar3 * 0x100;
      sVar39 = sVar39 - 1;
      pbVar44 = pbVar42 + 1;
      uVar45 = (uVar35 + *pbVar42) - 2;
      if (2 < (uVar35 | *pbVar42)) {
        do {
          sVar41 = sVar39;
          pbVar42 = pbVar44;
          if (sVar39 == 0) {
            bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
            if (bVar27 == 0) goto LAB_00106a0d;
            pbVar42 = pjVar8->next_input_byte;
            sVar41 = pjVar8->bytes_in_buffer;
          }
          bVar3 = *pbVar42;
          uVar37 = bVar3 & 0xf;
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x53;
          (pjVar30->msg_parm).i[0] = uVar37;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)(bVar3 >> 4);
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (3 < uVar37) {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 0x20;
            (pjVar30->msg_parm).i[0] = uVar37;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          pJVar33 = cinfo->quant_tbl_ptrs[uVar37];
          if (pJVar33 == (JQUANT_TBL *)0x0) {
            pJVar33 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
            cinfo->quant_tbl_ptrs[uVar37] = pJVar33;
          }
          local_150 = uVar45 - 1;
          uVar35 = 0x40;
          if (bVar3 < 0x10) {
            local_1b0 = jpeg_natural_order;
            if (0x40 < uVar45) goto LAB_00106330;
            lVar34 = 0;
            do {
              pUVar1 = pJVar33->quantval + lVar34;
              pUVar1[0] = 1;
              pUVar1[1] = 1;
              pUVar1[2] = 1;
              pUVar1[3] = 1;
              pUVar1[4] = 1;
              pUVar1[5] = 1;
              pUVar1[6] = 1;
              pUVar1[7] = 1;
              lVar34 = lVar34 + 8;
              uVar35 = local_150;
            } while (lVar34 != 0x40);
LAB_001062ab:
            if (0x18 < (long)uVar35) {
              if (uVar35 == 0x19) {
                local_1b0 = jpeg_natural_order5;
              }
              else if (uVar35 == 0x24) {
                local_1b0 = jpeg_natural_order6;
              }
              else {
                if (uVar35 != 0x31) goto LAB_001062f9;
                local_1b0 = jpeg_natural_order7;
              }
              goto LAB_00106330;
            }
            if (uVar35 == 4) {
              local_1b0 = jpeg_natural_order2;
              goto LAB_00106330;
            }
            if (uVar35 == 9) {
              local_1b0 = jpeg_natural_order3;
              goto LAB_00106330;
            }
            if (uVar35 == 0x10) {
              local_1b0 = jpeg_natural_order4;
              goto LAB_00106330;
            }
LAB_001062f9:
            sVar39 = sVar41 - 1;
            pbVar44 = pbVar42 + 1;
            local_1b0 = jpeg_natural_order;
            if (0 < (long)uVar35) goto LAB_00106330;
          }
          else {
            local_1b0 = jpeg_natural_order;
            if (uVar45 < 0x81) {
              lVar34 = 0;
              do {
                pUVar1 = pJVar33->quantval + lVar34;
                pUVar1[0] = 1;
                pUVar1[1] = 1;
                pUVar1[2] = 1;
                pUVar1[3] = 1;
                pUVar1[4] = 1;
                pUVar1[5] = 1;
                pUVar1[6] = 1;
                pUVar1[7] = 1;
                lVar34 = lVar34 + 8;
              } while (lVar34 != 0x40);
              uVar35 = local_150 >> 1;
              goto LAB_001062ab;
            }
LAB_00106330:
            sVar39 = sVar41 - 1;
            pbVar44 = pbVar42 + 1;
            uVar45 = 0;
            do {
              if (bVar3 < 0x10) {
                if (sVar39 == 0) {
                  bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
                  if (bVar27 == 0) goto LAB_00106a0d;
                  pbVar44 = pjVar8->next_input_byte;
                  sVar39 = pjVar8->bytes_in_buffer;
                }
                UVar36 = (UINT16)*pbVar44;
              }
              else {
                if (sVar39 == 0) {
                  bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
                  if (bVar27 == 0) goto LAB_00106a0d;
                  pbVar44 = pjVar8->next_input_byte;
                  sVar39 = pjVar8->bytes_in_buffer;
                }
                bVar4 = *pbVar44;
                sVar39 = sVar39 - 1;
                if (sVar39 == 0) {
                  bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
                  if (bVar27 == 0) goto LAB_00106a0d;
                  pbVar44 = pjVar8->next_input_byte;
                  sVar39 = pjVar8->bytes_in_buffer;
                }
                else {
                  pbVar44 = pbVar44 + 1;
                }
                UVar36 = CONCAT11(bVar4,*pbVar44);
              }
              pJVar33->quantval[local_1b0[uVar45]] = UVar36;
              uVar45 = uVar45 + 1;
              sVar39 = sVar39 - 1;
              pbVar44 = pbVar44 + 1;
            } while (uVar35 != uVar45);
          }
          if (1 < cinfo->err->trace_level) {
            uVar45 = 0xfffffffffffffff8;
            do {
              pjVar30 = cinfo->err;
              uVar2 = *(ulong *)(pJVar33->quantval + uVar45 + 8);
              auVar10._8_4_ = 0;
              auVar10._0_8_ = uVar2;
              auVar10._12_2_ = (short)(uVar2 >> 0x30);
              auVar12._8_2_ = (short)(uVar2 >> 0x20);
              auVar12._0_8_ = uVar2;
              auVar12._10_4_ = auVar10._10_4_;
              auVar23._6_8_ = 0;
              auVar23._0_6_ = auVar12._8_6_;
              auVar52._6_8_ = SUB148(auVar23 << 0x40,6);
              auVar52._4_2_ = (short)(uVar2 >> 0x10);
              auVar52._0_2_ = (ushort)uVar2;
              auVar52._2_2_ = 0;
              auVar52._14_2_ = 0;
              *(undefined1 (*) [16])&pjVar30->msg_parm = auVar52;
              uVar2 = *(ulong *)(pJVar33->quantval + uVar45 + 0xc);
              auVar9._8_4_ = 0;
              auVar9._0_8_ = uVar2;
              auVar9._12_2_ = (short)(uVar2 >> 0x30);
              auVar11._8_2_ = (short)(uVar2 >> 0x20);
              auVar11._0_8_ = uVar2;
              auVar11._10_4_ = auVar9._10_4_;
              auVar24._6_8_ = 0;
              auVar24._0_6_ = auVar11._8_6_;
              auVar53._6_8_ = SUB148(auVar24 << 0x40,6);
              auVar53._4_2_ = (short)(uVar2 >> 0x10);
              auVar53._0_2_ = (ushort)uVar2;
              auVar53._2_2_ = 0;
              auVar53._14_2_ = 0;
              *(undefined1 (*) [16])((long)&pjVar30->msg_parm + 0x10) = auVar53;
              pjVar30->msg_code = 0x5f;
              (*pjVar30->emit_message)((j_common_ptr)cinfo,2);
              uVar45 = uVar45 + 8;
            } while (uVar45 < 0x38);
          }
          uVar45 = uVar35;
          if (bVar3 < 0x10) {
            uVar45 = 0;
          }
          uVar45 = local_150 - (uVar45 + uVar35);
        } while (0 < (long)uVar45);
      }
      if (uVar45 != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xc;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      pjVar8->next_input_byte = pbVar44;
      pjVar8->bytes_in_buffer = sVar39;
      break;
    case 0xdc:
      iVar28 = skip_variable(cinfo);
      goto LAB_00105c53;
    case 0xdd:
      pjVar8 = cinfo->src;
      sVar39 = pjVar8->bytes_in_buffer;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      JVar5 = *pjVar8->next_input_byte;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pJVar40 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pJVar40 = pjVar8->next_input_byte + 1;
      }
      if (CONCAT11(JVar5,*pJVar40) != 4) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xc;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pJVar40 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pJVar40 = pJVar40 + 1;
      }
      JVar5 = *pJVar40;
      sVar39 = sVar39 - 1;
      if (sVar39 == 0) {
        bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
        if (bVar27 == 0) goto LAB_00106a0d;
        pJVar40 = pjVar8->next_input_byte;
        sVar39 = pjVar8->bytes_in_buffer;
      }
      else {
        pJVar40 = pJVar40 + 1;
      }
      JVar6 = *pJVar40;
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x54;
      (pjVar30->msg_parm).i[0] = (uint)CONCAT11(JVar5,JVar6);
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      cinfo->restart_interval = (uint)CONCAT11(JVar5,JVar6);
      pjVar8->next_input_byte = pJVar40 + 1;
      pjVar8->bytes_in_buffer = sVar39 - 1;
      break;
    case 0xde:
    case 0xdf:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
switchD_00105c3b_caseD_de:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x46;
LAB_00105c6a:
      (pjVar30->msg_parm).i[0] = uVar37;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      break;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
      iVar28 = (*(&cinfo->marker[1].read_markers)[uVar37 - 0xe0])(cinfo);
      goto LAB_00105c53;
    case 0xfe:
      iVar28 = (*cinfo->marker[1].reset_marker_reader)(cinfo);
LAB_00105c53:
      if (iVar28 == 0) goto LAB_00106a0d;
      break;
    default:
      if (uVar37 != 1) goto switchD_00105c3b_caseD_de;
switchD_00105c3b_caseD_d0:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x5e;
      (pjVar30->msg_parm).i[0] = uVar37;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    cinfo->unread_marker = 0;
    uVar37 = 0;
  } while( true );
LAB_0010681a:
  do {
    if (sVar39 == 0) {
      bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
      if (bVar27 == 0) goto LAB_00106a0d;
      pbVar42 = pjVar8->next_input_byte;
      sVar39 = pjVar8->bytes_in_buffer;
    }
    bVar4 = *pbVar42;
    sVar39 = sVar39 - 1;
    if (sVar39 == 0) {
      bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
      if (bVar27 == 0) goto LAB_00106a0d;
      pbVar42 = pjVar8->next_input_byte;
      sVar39 = pjVar8->bytes_in_buffer;
    }
    else {
      pbVar42 = pbVar42 + 1;
    }
    bVar7 = *pbVar42;
    pjVar46 = cinfo->comp_info;
    iVar28 = cinfo->num_components;
    uVar37 = (uint)bVar4;
    if (0 < iVar28) {
      do {
        if (pjVar46->component_id == uVar37) goto LAB_0010689d;
        pjVar46 = pjVar46 + 1;
        iVar28 = iVar28 + -1;
      } while (iVar28 != 0);
    }
    pjVar30 = cinfo->err;
    pjVar30->msg_code = 4;
    (pjVar30->msg_parm).i[0] = uVar37;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_0010689d:
    cinfo->cur_comp_info[uVar45] = pjVar46;
    pjVar46->dc_tbl_no = (uint)(bVar7 >> 4);
    pjVar46->ac_tbl_no = bVar7 & 0xf;
    pjVar30 = cinfo->err;
    (pjVar30->msg_parm).i[0] = uVar37;
    (pjVar30->msg_parm).i[1] = pjVar46->dc_tbl_no;
    (pjVar30->msg_parm).i[2] = pjVar46->ac_tbl_no;
    pjVar30->msg_code = 0x6a;
    (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
    uVar45 = uVar45 + 1;
    pbVar42 = pbVar42 + 1;
    sVar39 = sVar39 - 1;
  } while (uVar45 != bVar3);
  bVar47 = false;
LAB_00106902:
  if (sVar39 == 0) {
    bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
    if (bVar27 != 0) {
      pbVar42 = pjVar8->next_input_byte;
      sVar39 = pjVar8->bytes_in_buffer;
      goto LAB_00106922;
    }
LAB_00106a0d:
    iVar28 = 0;
  }
  else {
LAB_00106922:
    cinfo->Ss = (uint)*pbVar42;
    sVar39 = sVar39 - 1;
    if (sVar39 == 0) {
      bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
      if (bVar27 == 0) goto LAB_00106a0d;
      pbVar42 = pjVar8->next_input_byte;
      sVar39 = pjVar8->bytes_in_buffer;
    }
    else {
      pbVar42 = pbVar42 + 1;
    }
    cinfo->Se = (uint)*pbVar42;
    sVar39 = sVar39 - 1;
    if (sVar39 == 0) {
      bVar27 = (*pjVar8->fill_input_buffer)(cinfo);
      if (bVar27 == 0) goto LAB_00106a0d;
      pbVar42 = pjVar8->next_input_byte;
      sVar39 = pjVar8->bytes_in_buffer;
    }
    else {
      pbVar42 = pbVar42 + 1;
    }
    bVar3 = *pbVar42;
    cinfo->Ah = (uint)(bVar3 >> 4);
    cinfo->Al = bVar3 & 0xf;
    pjVar30 = cinfo->err;
    (pjVar30->msg_parm).i[0] = cinfo->Ss;
    (pjVar30->msg_parm).i[1] = cinfo->Se;
    (pjVar30->msg_parm).i[2] = cinfo->Ah;
    (pjVar30->msg_parm).i[3] = cinfo->Al;
    pjVar30->msg_code = 0x6b;
    iVar28 = 1;
    (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
    cinfo->marker->next_restart_num = 0;
    if (!bVar47) {
      cinfo->input_scan_number = cinfo->input_scan_number + 1;
    }
    pjVar8->next_input_byte = pbVar42 + 1;
    pjVar8->bytes_in_buffer = sVar39 - 1;
    cinfo->unread_marker = 0;
  }
  return iVar28;
}

Assistant:

METHODDEF(int)
read_markers (j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (! cinfo->marker->saw_SOI) {
	if (! first_marker(cinfo))
	  return JPEG_SUSPENDED;
      } else {
	if (! next_marker(cinfo))
	  return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (! get_soi(cinfo))
	return JPEG_SUSPENDED;
      break;

    case M_SOF0:		/* Baseline */
      if (! get_sof(cinfo, TRUE, FALSE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF1:		/* Extended sequential, Huffman */
      if (! get_sof(cinfo, FALSE, FALSE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF2:		/* Progressive, Huffman */
      if (! get_sof(cinfo, FALSE, TRUE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF9:		/* Extended sequential, arithmetic */
      if (! get_sof(cinfo, FALSE, FALSE, TRUE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF10:		/* Progressive, arithmetic */
      if (! get_sof(cinfo, FALSE, TRUE, TRUE))
	return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:		/* Lossless, Huffman */
    case M_SOF5:		/* Differential sequential, Huffman */
    case M_SOF6:		/* Differential progressive, Huffman */
    case M_SOF7:		/* Differential lossless, Huffman */
    case M_JPG:			/* Reserved for JPEG extensions */
    case M_SOF11:		/* Lossless, arithmetic */
    case M_SOF13:		/* Differential sequential, arithmetic */
    case M_SOF14:		/* Differential progressive, arithmetic */
    case M_SOF15:		/* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (! get_sos(cinfo))
	return JPEG_SUSPENDED;
      cinfo->unread_marker = 0;	/* processed the marker */
      return JPEG_REACHED_SOS;
    
    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0;	/* processed the marker */
      return JPEG_REACHED_EOI;
      
    case M_DAC:
      if (! get_dac(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DHT:
      if (! get_dht(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DQT:
      if (! get_dqt(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DRI:
      if (! get_dri(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (! (*((my_marker_ptr) cinfo->marker)->process_APPn[
		cinfo->unread_marker - (int) M_APP0]) (cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_COM:
      if (! (*((my_marker_ptr) cinfo->marker)->process_COM) (cinfo))
	return JPEG_SUSPENDED;
      break;

    case M_RST0:		/* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:			/* Ignore DNL ... perhaps the wrong thing */
      if (! skip_variable(cinfo))
	return JPEG_SUSPENDED;
      break;

    default:			/* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}